

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

bool minihttp::_SetNonBlocking(SOCKET s,bool nonblock)

{
  int iVar1;
  undefined4 local_28;
  int tmp;
  bool nonblock_local;
  SOCKET s_local;
  
  if (s == -1) {
    s_local._7_1_ = false;
  }
  else {
    local_28 = fcntl((int)s,3);
    if ((int)local_28 < 0) {
      s_local._7_1_ = false;
    }
    else {
      if (nonblock) {
        local_28 = local_28 | 0x800;
      }
      else {
        local_28 = local_28 | 0xfffff7ff;
      }
      iVar1 = fcntl((int)s,4,(ulong)local_28);
      if (iVar1 < 0) {
        s_local._7_1_ = false;
      }
      else {
        s_local._7_1_ = true;
      }
    }
  }
  return s_local._7_1_;
}

Assistant:

static bool _SetNonBlocking(SOCKET s, bool nonblock)
{
    if(!SOCKETVALID(s))
        return false;
#ifdef MINIHTTP_USE_MBEDTLS
    if(nonblock)
        return mbedtls_net_set_nonblock((mbedtls_net_context*)&s) == 0; // this horrible hackery is okay as long as the compile assert in HasSSL() holds
    else
        return mbedtls_net_set_block((mbedtls_net_context*)&s) == 0;
#elif defined(_WIN32)
    ULONG tmp = !!nonblock;
    if(::ioctlsocket(s, FIONBIO, &tmp) == SOCKET_ERROR)
        return false;
#else
    int tmp = ::fcntl(s, F_GETFL);
    if(tmp < 0)
        return false;
    if(::fcntl(s, F_SETFL, nonblock ? (tmp|O_NONBLOCK) : (tmp|=~O_NONBLOCK)) < 0)
        return false;
#endif
    return true;
}